

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Saig_Bmc_t *
Saig_BmcManStart(Aig_Man_t *pAig,int nFramesMax,int nNodesMax,int nConfMaxOne,int nConfMaxAll,
                int fVerbose,int fUseSatoko)

{
  uint nCapMin;
  Saig_Bmc_t *p;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  satoko_t *s;
  sat_solver *s_00;
  int iVar6;
  ulong uVar7;
  int Lit;
  int local_a0;
  int local_9c;
  satoko_opts_t opts;
  
  local_9c = fVerbose;
  p = (Saig_Bmc_t *)calloc(1,0x88);
  p->nFramesMax = nFramesMax;
  p->nNodesMax = nNodesMax;
  p->nConfMaxOne = nConfMaxOne;
  p->nConfMaxAll = nConfMaxAll;
  p->fVerbose = local_9c;
  p->pAig = pAig;
  nCapMin = pAig->vObjs->nSize;
  p->nObjs = nCapMin;
  local_a0 = nConfMaxOne;
  pVVar1 = Vec_PtrAlloc(100);
  p->vAig2Frm = pVVar1;
  uVar7 = 0;
  pVVar2 = Vec_IntAlloc(0);
  p->vObj2Var = pVVar2;
  Vec_IntGrow(pVVar2,nCapMin);
  uVar3 = 0;
  if (0 < (int)nCapMin) {
    uVar3 = (ulong)nCapMin;
  }
  for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    pVVar2->pArray[uVar7] = 0;
  }
  pVVar2->nSize = nCapMin;
  pAVar4 = Aig_ManStart(nCapMin);
  p->pFrm = pAVar4;
  for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar6);
    Saig_BmcObjSetFrame(p,pAVar5,0,(Aig_Obj_t *)((ulong)pAVar4->pConst1 ^ 1));
  }
  Lit = 2;
  if (fUseSatoko == 0) {
    s_00 = sat_solver_new();
    p->pSat = s_00;
    s_00->nLearntMax = 10000;
    s_00->nLearntStart = 10000;
    s_00->nLearntDelta = 5000;
    s_00->nLearntRatio = 0x4b;
    sat_solver_setnvars(s_00,2000);
    sat_solver_addclause(s_00,&Lit,&local_a0);
  }
  else {
    satoko_default_opts(&opts);
    opts.conf_limit = (long)local_a0;
    s = satoko_create();
    p->pSat2 = s;
    satoko_configure(s,&opts);
    satoko_setnvars(s,2000);
    satoko_add_clause(s,&Lit,1);
  }
  pAVar5 = pAVar4->pConst1;
  p->nSatVars = 2;
  Saig_BmcSetSatNum(p,pAVar5,1);
  pVVar1 = Vec_PtrAlloc(1000);
  p->vTargets = pVVar1;
  pVVar2 = Vec_IntAlloc(1000);
  p->vVisited = pVVar2;
  p->iFrameFail = -1;
  p->iOutputFail = -1;
  return p;
}

Assistant:

Saig_Bmc_t * Saig_BmcManStart( Aig_Man_t * pAig, int nFramesMax, int nNodesMax, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Obj_t * pObj;
    int i, Lit;
//    assert( Aig_ManRegNum(pAig) > 0 );
    p = (Saig_Bmc_t *)ABC_ALLOC( char, sizeof(Saig_Bmc_t) );
    memset( p, 0, sizeof(Saig_Bmc_t) );
    // set parameters
    p->nFramesMax   = nFramesMax;
    p->nNodesMax    = nNodesMax;
    p->nConfMaxOne  = nConfMaxOne;
    p->nConfMaxAll  = nConfMaxAll;
    p->fVerbose     = fVerbose;
    p->pAig         = pAig;
    p->nObjs        = Aig_ManObjNumMax(pAig);
    // create node and variable mappings
    p->vAig2Frm     = Vec_PtrAlloc( 100 );
    p->vObj2Var     = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vObj2Var, p->nObjs, 0 );
    // start the AIG manager and map primary inputs
    p->pFrm         = Aig_ManStart( p->nObjs );
    Saig_ManForEachLo( pAig, pObj, i )
        Saig_BmcObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrm) ); 
    // create SAT solver
    p->nSatVars     = 1;
    Lit = toLit( p->nSatVars );
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfMaxOne;
        p->pSat2 = satoko_create();  
        satoko_configure(p->pSat2, &opts);
        satoko_setnvars(p->pSat2, 2000);
        satoko_add_clause( p->pSat2, &Lit, 1 );
    }
    else
    {
        p->pSat = sat_solver_new();
        p->pSat->nLearntStart = 10000;//p->pPars->nLearnedStart;
        p->pSat->nLearntDelta =  5000;//p->pPars->nLearnedDelta;
        p->pSat->nLearntRatio =    75;//p->pPars->nLearnedPerce;
        p->pSat->nLearntMax   = p->pSat->nLearntStart;
        sat_solver_setnvars( p->pSat, 2000 );
        sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    }
    Saig_BmcSetSatNum( p, Aig_ManConst1(p->pFrm), p->nSatVars++ );
    // other data structures
    p->vTargets     = Vec_PtrAlloc( 1000 );
    p->vVisited     = Vec_IntAlloc( 1000 );
    p->iOutputFail  = -1;
    p->iFrameFail   = -1;
    return p;
}